

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O0

_Bool uncurse_object(object *obj,wchar_t strength,char *dice_string)

{
  byte bVar1;
  _Bool _Var2;
  int16_t iVar3;
  wchar_t wVar4;
  uint32_t uVar5;
  char local_b8 [8];
  char dam_text [16];
  wchar_t dam;
  _Bool none_left;
  object *destroyed;
  char o_name [80];
  wchar_t local_3c;
  curse_data curse;
  wchar_t new_weight;
  wchar_t old_weight;
  wchar_t index;
  char *dice_string_local;
  object *poStack_18;
  wchar_t strength_local;
  object *obj_local;
  
  new_weight = L'\0';
  bVar1 = obj->number;
  _old_weight = dice_string;
  dice_string_local._4_4_ = strength;
  poStack_18 = obj;
  iVar3 = object_weight_one(obj);
  wVar4 = (uint)bVar1 * (int)iVar3;
  _Var2 = get_curse(&new_weight,poStack_18,_old_weight);
  if (_Var2) {
    local_3c = poStack_18->curses[new_weight].power;
    if (local_3c < L'd') {
      if (dice_string_local._4_4_ < local_3c) {
        _Var2 = flag_has_dbg(poStack_18->flags,5,0x1d,"obj->flags","OF_FRAGILE");
        curse.power = wVar4;
        if (_Var2) {
          uVar5 = Rand_div(4);
          if (uVar5 == 0) {
            dam_text[0xf] = '\0';
            dam_text._8_4_ = damroll(5,5);
            memset(local_b8,0,0x10);
            dam_text._8_4_ = player_apply_damage_reduction(player,dam_text._8_4_);
            if ((L'\0' < (int)dam_text._8_4_) && (((player->opts).opt[3] & 1U) != 0)) {
              strnfmt(local_b8,0x10," (%d)");
            }
            msg("%s%s","There is a bang and a flash!",local_b8);
            _Var2 = object_is_carried(player,poStack_18);
            if (_Var2) {
              _dam = gear_object_for_use(player,poStack_18,L'\x01',false,(_Bool *)(dam_text + 0xf));
              if (_dam->artifact != (artifact *)0x0) {
                history_lose_artifact(player,_dam->artifact);
              }
              object_delete((chunk *)player->cave,(chunk *)0x0,&_dam->known);
              object_delete((chunk *)cave,(chunk *)player->cave,(object **)&dam);
            }
            else {
              square_delete_object((chunk *)cave,poStack_18->grid,poStack_18,true,true);
            }
            take_hit(player,dam_text._8_4_,"Failed uncursing");
          }
          else {
            msg("The removal fails.");
          }
        }
        else {
          object_desc((char *)&destroyed,0x50,poStack_18,3,player);
          msgt(0x7f,"The spell fails; your %s is now fragile.",&destroyed);
          flag_on_dbg(poStack_18->flags,5,0x1d,"obj->flags","OF_FRAGILE");
          player_learn_flag(player,L'\x1d');
        }
      }
      else {
        remove_object_curse(poStack_18->known,new_weight,false);
        remove_object_curse(poStack_18,new_weight,true);
        bVar1 = poStack_18->number;
        iVar3 = object_weight_one(poStack_18);
        curse.power = (uint)bVar1 * (int)iVar3;
      }
      player->upkeep->total_weight = (curse.power - wVar4) + player->upkeep->total_weight;
      player->upkeep->notice = player->upkeep->notice | 1;
      player->upkeep->update = player->upkeep->update | 1;
      player->upkeep->redraw = player->upkeep->redraw | 0x60000;
      obj_local._7_1_ = true;
    }
    else {
      obj_local._7_1_ = false;
    }
  }
  else {
    obj_local._7_1_ = false;
  }
  return obj_local._7_1_;
}

Assistant:

static bool uncurse_object(struct object *obj, int strength, char *dice_string)
{
	int index = 0;
	int old_weight = obj->number * object_weight_one(obj);
	int new_weight = old_weight;

	if (get_curse(&index, obj, dice_string)) {
		struct curse_data curse = obj->curses[index];
		char o_name[80];

		if (curse.power >= 100) {
			/* Curse is permanent */
			return false;
		} else if (strength >= curse.power) {
			/* Successfully removed this curse */
			remove_object_curse(obj->known, index, false);
			remove_object_curse(obj, index, true);
			new_weight = obj->number * object_weight_one(obj);
		} else if (!of_has(obj->flags, OF_FRAGILE)) {
			/* Failure to remove, object is now fragile */
			object_desc(o_name, sizeof(o_name), obj, ODESC_FULL,
				player);
			msgt(MSG_CURSED, "The spell fails; your %s is now fragile.", o_name);
			of_on(obj->flags, OF_FRAGILE);
			player_learn_flag(player, OF_FRAGILE);
		} else if (one_in_(4)) {
			/* Failure - unlucky fragile object is destroyed */
			struct object *destroyed;
			bool none_left = false;
			int dam = damroll(5, 5);
			char dam_text[16] = "";

			dam = player_apply_damage_reduction(player, dam);
			if (dam > 0 && OPT(player, show_damage)) {
				strnfmt(dam_text, sizeof(dam_text), " (%d)",
					dam);
			}
			msg("%s%s", "There is a bang and a flash!", dam_text);
			if (object_is_carried(player, obj)) {
				destroyed = gear_object_for_use(player, obj,
					1, false, &none_left);
				if (destroyed->artifact) {
					/* Artifacts are marked as lost */
					history_lose_artifact(player, destroyed->artifact);
				}
				object_delete(player->cave, NULL, &destroyed->known);
				object_delete(cave, player->cave, &destroyed);
			} else {
				square_delete_object(cave, obj->grid, obj, true, true);
			}
			take_hit(player, dam, "Failed uncursing");
		} else {
			/* Non-destructive failure */
			msg("The removal fails.");
		}
	} else {
		return false;
	}
	player->upkeep->total_weight += new_weight - old_weight;
	player->upkeep->notice |= (PN_COMBINE);
	player->upkeep->update |= (PU_BONUS);
	player->upkeep->redraw |= (PR_EQUIP | PR_INVEN);
	return true;
}